

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuckoocache.h
# Opt level: O0

void __thiscall
CuckooCache::bit_packed_atomic_flags::bit_packed_atomic_flags
          (bit_packed_atomic_flags *this,uint32_t size)

{
  long lVar1;
  uint uVar2;
  void *pvVar3;
  int in_ESI;
  ulong uVar4;
  long in_FS_OFFSET;
  uint32_t i;
  memory_order __b;
  __memory_order_modifier in_stack_ffffffffffffff58;
  memory_order in_stack_ffffffffffffff5c;
  size_t in_stack_ffffffffffffff60;
  unique_ptr<std::atomic<unsigned_char>[],_std::default_delete<std::atomic<unsigned_char>[]>_>
  *in_stack_ffffffffffffff68;
  void *local_70;
  uint local_40;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::unique_ptr<std::atomic<unsigned_char>[],std::default_delete<std::atomic<unsigned_char>[]>>::
  unique_ptr<std::default_delete<std::atomic<unsigned_char>[]>,void>
            ((unique_ptr<std::atomic<unsigned_char>[],_std::default_delete<std::atomic<unsigned_char>[]>_>
              *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  uVar2 = in_ESI + 7U >> 3;
  uVar4 = (ulong)uVar2;
  local_70 = operator_new__(uVar4);
  if (uVar4 != 0) {
    pvVar3 = (void *)((long)local_70 + uVar4);
    do {
      std::atomic<unsigned_char>::atomic
                ((atomic<unsigned_char> *)
                 CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
      local_70 = (void *)((long)local_70 + 1);
    } while (local_70 != pvVar3);
  }
  std::unique_ptr<std::atomic<unsigned_char>[],std::default_delete<std::atomic<unsigned_char>[]>>::
  reset<std::atomic<unsigned_char>*,void>
            ((unique_ptr<std::atomic<unsigned_char>[],_std::default_delete<std::atomic<unsigned_char>[]>_>
              *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
             (atomic<unsigned_char> *)0x830c4a);
  for (local_40 = 0; local_40 < uVar2; local_40 = local_40 + 1) {
    in_stack_ffffffffffffff68 =
         (unique_ptr<std::atomic<unsigned_char>[],_std::default_delete<std::atomic<unsigned_char>[]>_>
          *)std::
            unique_ptr<std::atomic<unsigned_char>[],_std::default_delete<std::atomic<unsigned_char>[]>_>
            ::operator[](in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
    std::operator&(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58);
    LOCK();
    *(__int_type_conflict4 *)
     &(in_stack_ffffffffffffff68->_M_t).
      super___uniq_ptr_impl<std::atomic<unsigned_char>,_std::default_delete<std::atomic<unsigned_char>[]>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::atomic<unsigned_char>_*,_std::default_delete<std::atomic<unsigned_char>[]>_>
      .super__Head_base<0UL,_std::atomic<unsigned_char>_*,_false>._M_head_impl = 0xff;
    UNLOCK();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

explicit bit_packed_atomic_flags(uint32_t size)
    {
        // pad out the size if needed
        size = (size + 7) / 8;
        mem.reset(new std::atomic<uint8_t>[size]);
        for (uint32_t i = 0; i < size; ++i)
            mem[i].store(0xFF);
    }